

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.cc
# Opt level: O0

string * google::protobuf::internal::StringTypeHandlerBase::New_abi_cxx11_(void)

{
  string *this;
  
  this = (string *)operator_new(0x20);
  std::__cxx11::string::string((string *)this);
  return this;
}

Assistant:

string* StringTypeHandlerBase::New() {
  return new string;
}